

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Optimisations.h
# Opt level: O2

Expression * __thiscall soul::Optimisations::Inliner::cloneExpression(Inliner *this,Expression *old)

{
  Module *pMVar1;
  int iVar2;
  Constant *pCVar3;
  Constant *pCVar4;
  Variable *pVVar5;
  BinaryOperator *pBVar6;
  BinaryOperator *pBVar7;
  Expression *pEVar8;
  Expression *args_2;
  UnaryOperator *pUVar9;
  UnaryOperator *pUVar10;
  TypeCast *pTVar11;
  TypeCast *pTVar12;
  PureFunctionCall *__fn;
  undefined4 extraout_var;
  ArrayElement *old_00;
  StructElement *old_01;
  ProcessorProperty *pPVar13;
  ProcessorProperty *pPVar14;
  int in_ECX;
  void *__child_stack;
  void *in_R8;
  pool_ptr<soul::heart::ProcessorProperty> pp;
  pool_ptr<soul::heart::Variable> local_30;
  
  cast<soul::heart::Constant,soul::heart::Expression>((soul *)&local_30,old);
  if (local_30.object == (Variable *)0x0) {
    cast<soul::heart::BinaryOperator,soul::heart::Expression>((soul *)&local_30,old);
    if (local_30.object == (Variable *)0x0) {
      cast<soul::heart::UnaryOperator,soul::heart::Expression>((soul *)&local_30,old);
      if (local_30.object == (Variable *)0x0) {
        cast<soul::heart::TypeCast,soul::heart::Expression>((soul *)&local_30,old);
        if (local_30.object == (Variable *)0x0) {
          cast<soul::heart::PureFunctionCall,soul::heart::Expression>((soul *)&local_30,old);
          if (local_30.object == (Variable *)0x0) {
            cast<soul::heart::Variable,soul::heart::Expression>((soul *)&local_30,old);
            if (local_30.object == (Variable *)0x0) {
              cast<soul::heart::ArrayElement,soul::heart::Expression>((soul *)&local_30,old);
              if (local_30.object == (Variable *)0x0) {
                cast<soul::heart::StructElement,soul::heart::Expression>((soul *)&local_30,old);
                if (local_30.object == (Variable *)0x0) {
                  cast<soul::heart::ProcessorProperty,soul::heart::Expression>
                            ((soul *)&local_30,old);
                  pMVar1 = this->module;
                  pPVar13 = pool_ptr<soul::heart::ProcessorProperty>::operator->
                                      ((pool_ptr<soul::heart::ProcessorProperty> *)&local_30);
                  pPVar14 = pool_ptr<soul::heart::ProcessorProperty>::operator->
                                      ((pool_ptr<soul::heart::ProcessorProperty> *)&local_30);
                  pVVar5 = (Variable *)
                           Module::
                           allocate<soul::heart::ProcessorProperty,soul::CodeLocation&,soul::heart::ProcessorProperty::Property_const&>
                                     (pMVar1,&(pPVar13->super_Expression).super_Object.location,
                                      &pPVar14->property);
                }
                else {
                  old_01 = pool_ptr<soul::heart::StructElement>::operator*
                                     ((pool_ptr<soul::heart::StructElement> *)&local_30);
                  pVVar5 = (Variable *)cloneStructElement(this,old_01);
                }
              }
              else {
                old_00 = pool_ptr<soul::heart::ArrayElement>::operator*
                                   ((pool_ptr<soul::heart::ArrayElement> *)&local_30);
                pVVar5 = (Variable *)cloneArrayElement(this,old_00);
              }
            }
            else {
              pVVar5 = pool_ptr<soul::heart::Variable>::operator*(&local_30);
              pVVar5 = getRemappedVariable(this,pVVar5);
            }
          }
          else {
            __fn = pool_ptr<soul::heart::PureFunctionCall>::operator*
                             ((pool_ptr<soul::heart::PureFunctionCall> *)&local_30);
            iVar2 = clone(this,(__fn *)__fn,__child_stack,in_ECX,in_R8);
            pVVar5 = (Variable *)CONCAT44(extraout_var,iVar2);
          }
        }
        else {
          pMVar1 = this->module;
          pTVar11 = pool_ptr<soul::heart::TypeCast>::operator->
                              ((pool_ptr<soul::heart::TypeCast> *)&local_30);
          pTVar12 = pool_ptr<soul::heart::TypeCast>::operator->
                              ((pool_ptr<soul::heart::TypeCast> *)&local_30);
          pEVar8 = cloneExpression(this,(pTVar12->source).object);
          pTVar12 = pool_ptr<soul::heart::TypeCast>::operator->
                              ((pool_ptr<soul::heart::TypeCast> *)&local_30);
          pVVar5 = (Variable *)
                   Module::
                   allocate<soul::heart::TypeCast,soul::CodeLocation&,soul::heart::Expression&,soul::Type&>
                             (pMVar1,&(pTVar11->super_Expression).super_Object.location,pEVar8,
                              &pTVar12->destType);
        }
      }
      else {
        pMVar1 = this->module;
        pUVar9 = pool_ptr<soul::heart::UnaryOperator>::operator->
                           ((pool_ptr<soul::heart::UnaryOperator> *)&local_30);
        pUVar10 = pool_ptr<soul::heart::UnaryOperator>::operator->
                            ((pool_ptr<soul::heart::UnaryOperator> *)&local_30);
        pEVar8 = cloneExpression(this,(pUVar10->source).object);
        pUVar10 = pool_ptr<soul::heart::UnaryOperator>::operator->
                            ((pool_ptr<soul::heart::UnaryOperator> *)&local_30);
        pVVar5 = (Variable *)
                 Module::
                 allocate<soul::heart::UnaryOperator,soul::CodeLocation&,soul::heart::Expression&,soul::UnaryOp::Op&>
                           (pMVar1,&(pUVar9->super_Expression).super_Object.location,pEVar8,
                            &pUVar10->operation);
      }
    }
    else {
      pMVar1 = this->module;
      pBVar6 = pool_ptr<soul::heart::BinaryOperator>::operator->
                         ((pool_ptr<soul::heart::BinaryOperator> *)&local_30);
      pBVar7 = pool_ptr<soul::heart::BinaryOperator>::operator->
                         ((pool_ptr<soul::heart::BinaryOperator> *)&local_30);
      pEVar8 = cloneExpression(this,(pBVar7->lhs).object);
      pBVar7 = pool_ptr<soul::heart::BinaryOperator>::operator->
                         ((pool_ptr<soul::heart::BinaryOperator> *)&local_30);
      args_2 = cloneExpression(this,(pBVar7->rhs).object);
      pBVar7 = pool_ptr<soul::heart::BinaryOperator>::operator->
                         ((pool_ptr<soul::heart::BinaryOperator> *)&local_30);
      pVVar5 = (Variable *)
               Module::
               allocate<soul::heart::BinaryOperator,soul::CodeLocation&,soul::heart::Expression&,soul::heart::Expression&,soul::BinaryOp::Op&>
                         (pMVar1,&(pBVar6->super_Expression).super_Object.location,pEVar8,args_2,
                          &pBVar7->operation);
    }
  }
  else {
    pMVar1 = this->module;
    pCVar3 = pool_ptr<soul::heart::Constant>::operator->
                       ((pool_ptr<soul::heart::Constant> *)&local_30);
    pCVar4 = pool_ptr<soul::heart::Constant>::operator->
                       ((pool_ptr<soul::heart::Constant> *)&local_30);
    pVVar5 = (Variable *)
             Module::allocate<soul::heart::Constant,soul::CodeLocation&,soul::Value&>
                       (pMVar1,&(pCVar3->super_Expression).super_Object.location,&pCVar4->value);
  }
  return &pVVar5->super_Expression;
}

Assistant:

heart::Expression& cloneExpression (heart::Expression& old)
        {
            if (auto c = cast<heart::Constant> (old))
                return module.allocate<heart::Constant> (c->location, c->value);

            if (auto b = cast<heart::BinaryOperator> (old))
                return module.allocate<heart::BinaryOperator> (b->location,
                                                               cloneExpression (b->lhs),
                                                               cloneExpression (b->rhs),
                                                               b->operation);

            if (auto u = cast<heart::UnaryOperator> (old))
                return module.allocate<heart::UnaryOperator> (u->location, cloneExpression (u->source), u->operation);

            if (auto t = cast<heart::TypeCast> (old))
                return module.allocate<heart::TypeCast> (t->location, cloneExpression (t->source), t->destType);

            if (auto f = cast<heart::PureFunctionCall> (old))
                return clone (*f);

            if (auto v = cast<heart::Variable> (old))
                return getRemappedVariable (*v);

            if (auto s = cast<heart::ArrayElement> (old))
                return cloneArrayElement (*s);

            if (auto s = cast<heart::StructElement> (old))
                return cloneStructElement (*s);

            auto pp = cast<heart::ProcessorProperty> (old);
            return module.allocate<heart::ProcessorProperty> (pp->location, pp->property);
        }